

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool do_pfirst_pnext(DisasContext_conflict1 *s,arg_rr_esz *a,
                     _func_void_TCGContext_ptr_TCGv_i32_TCGv_ptr_TCGv_ptr_TCGv_i32 *gen_fn)

{
  int iVar1;
  uint uVar2;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var3;
  undefined1 extraout_AL;
  TCGv_ptr ret;
  TCGv_ptr ret_00;
  TCGv_i32 t;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var3 = sve_access_check_aarch64(s);
  if (_Var3) {
    ret = tcg_temp_new_ptr(tcg_ctx);
    ret_00 = tcg_temp_new_ptr(tcg_ctx);
    iVar1 = s->sve_len;
    uVar2 = a->esz;
    tcg_gen_addi_i64_aarch64
              (tcg_ctx,(TCGv_i64)ret,(TCGv_i64)tcg_ctx->cpu_env,(long)(a->rd * 0x20 + 0x2c10));
    tcg_gen_addi_i64_aarch64
              (tcg_ctx,(TCGv_i64)ret_00,(TCGv_i64)tcg_ctx->cpu_env,(long)(a->rn * 0x20 + 0x2c10));
    t = tcg_const_i32_aarch64(tcg_ctx,(uVar2 & 3) << 10 | ((iVar1 >> 3) + 7) / 8 & 0xfffff3ffU);
    (*gen_fn)(tcg_ctx,t,ret,ret_00,t);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    do_pred_flags(tcg_ctx,t);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
    return (_Bool)extraout_AL;
  }
  return _Var3;
}

Assistant:

static bool do_pfirst_pnext(DisasContext *s, arg_rr_esz *a,
                            void (*gen_fn)(TCGContext *, TCGv_i32, TCGv_ptr,
                                           TCGv_ptr, TCGv_i32))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    TCGv_ptr t_pd = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr t_pg = tcg_temp_new_ptr(tcg_ctx);
    TCGv_i32 t;
    unsigned desc;

    desc = DIV_ROUND_UP(pred_full_reg_size(s), 8);
    desc = deposit32(desc, SIMD_DATA_SHIFT, 2, a->esz);

    tcg_gen_addi_ptr(tcg_ctx, t_pd, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rd));
    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rn));
    t = tcg_const_i32(tcg_ctx, desc);

    gen_fn(tcg_ctx, t, t_pd, t_pg, t);
    tcg_temp_free_ptr(tcg_ctx, t_pd);
    tcg_temp_free_ptr(tcg_ctx, t_pg);

    do_pred_flags(tcg_ctx, t);
    tcg_temp_free_i32(tcg_ctx, t);
    return true;
}